

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus
DecodeMemMultipleWritebackInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus DVar3;
  uint *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  uint Rn;
  uint RegNo;
  
  RegNo = Insn >> 0x10 & 0xf;
  if (Insn >> 0x1c == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 - 0x8e < 9) {
      Decoder_00 = (uint *)((long)&switchD_001505f8::switchdataD_001cb0cc +
                           (long)(int)(&switchD_001505f8::switchdataD_001cb0cc)[uVar1 - 0x8e]);
      switch(uVar1) {
      case 0x8e:
        uVar1 = 0x118;
        break;
      case 0x8f:
        uVar1 = 0x119;
        break;
      case 0x90:
        uVar1 = 0x11a;
        break;
      case 0x91:
        uVar1 = 0x11b;
        break;
      case 0x92:
        uVar1 = 0x11c;
        break;
      case 0x93:
        return MCDisassembler_Fail;
      case 0x94:
        uVar1 = 0x11d;
        break;
      case 0x95:
        uVar1 = 0x11e;
        break;
      case 0x96:
        uVar1 = 0x11f;
      }
    }
    else {
      Decoder_00 = &switchD_0015068d::switchdataD_001cb0f0;
      switch(uVar1) {
      case 0x195:
        uVar1 = 0x171;
        break;
      case 0x196:
        uVar1 = 0x172;
        break;
      case 0x197:
        uVar1 = 0x173;
        break;
      case 0x198:
        uVar1 = 0x174;
        break;
      case 0x199:
        uVar1 = 0x175;
        break;
      case 0x19a:
        uVar1 = 0x176;
        break;
      case 0x19b:
        uVar1 = 0x177;
        break;
      case 0x19c:
        uVar1 = 0x178;
        break;
      default:
        return MCDisassembler_Fail;
      }
    }
    MCInst_setOpcode(Inst,uVar1);
    if ((Insn >> 0x14 & 1) != 0) {
      MCOperand_CreateImm0(Inst,*(int64_t *)(&DAT_001ccb40 + (Insn >> 0x14 & 0x18)));
      DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address_03,Decoder_00);
      return *(DecodeStatus *)(&DAT_001ccb60 + (ulong)DVar2 * 4);
    }
    if ((Insn >> 0x16 & 1) != 0) {
      MCOperand_CreateImm0(Inst,(ulong)(Insn & 0xf));
      return MCDisassembler_Success;
    }
    return MCDisassembler_Fail;
  }
  DVar2 = DecodeGPRRegisterClass(Inst,RegNo,Address,Decoder);
  if ((DVar2 | 2) == MCDisassembler_Success) {
    DVar3 = DecodeGPRRegisterClass(Inst,RegNo,Address_00,Decoder);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
    DVar3 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,Decoder);
    if (DVar3 != MCDisassembler_Success) {
      if (DVar3 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar2 = MCDisassembler_SoftFail;
    }
    DVar3 = DecodeRegListOperand(Inst,Insn & 0xffff,Address_02,Decoder);
    if (DVar3 == MCDisassembler_Fail) {
      return MCDisassembler_Fail;
    }
    if (DVar3 == MCDisassembler_Success) {
      return DVar2;
    }
    if (DVar3 == MCDisassembler_SoftFail) {
      return MCDisassembler_SoftFail;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeMemMultipleWritebackInstruction(MCInst *Inst,
		unsigned Insn, uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned reglist = fieldFromInstruction_4(Insn, 0, 16);

	if (pred == 0xF) {
		// Ambiguous with RFE and SRS
		switch (MCInst_getOpcode(Inst)) {
			case ARM_LDMDA:
				MCInst_setOpcode(Inst, ARM_RFEDA);
				break;
			case ARM_LDMDA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDA_UPD);
				break;
			case ARM_LDMDB:
				MCInst_setOpcode(Inst, ARM_RFEDB);
				break;
			case ARM_LDMDB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEDB_UPD);
				break;
			case ARM_LDMIA:
				MCInst_setOpcode(Inst, ARM_RFEIA);
				break;
			case ARM_LDMIA_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIA_UPD);
				break;
			case ARM_LDMIB:
				MCInst_setOpcode(Inst, ARM_RFEIB);
				break;
			case ARM_LDMIB_UPD:
				MCInst_setOpcode(Inst, ARM_RFEIB_UPD);
				break;
			case ARM_STMDA:
				MCInst_setOpcode(Inst, ARM_SRSDA);
				break;
			case ARM_STMDA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDA_UPD);
				break;
			case ARM_STMDB:
				MCInst_setOpcode(Inst, ARM_SRSDB);
				break;
			case ARM_STMDB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSDB_UPD);
				break;
			case ARM_STMIA:
				MCInst_setOpcode(Inst, ARM_SRSIA);
				break;
			case ARM_STMIA_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIA_UPD);
				break;
			case ARM_STMIB:
				MCInst_setOpcode(Inst, ARM_SRSIB);
				break;
			case ARM_STMIB_UPD:
				MCInst_setOpcode(Inst, ARM_SRSIB_UPD);
				break;
			default:
				return MCDisassembler_Fail;
		}

		// For stores (which become SRS's, the only operand is the mode.
		if (fieldFromInstruction_4(Insn, 20, 1) == 0) {
			// Check SRS encoding constraints
			if (!(fieldFromInstruction_4(Insn, 22, 1) == 1 &&
						fieldFromInstruction_4(Insn, 20, 1) == 0))
				return MCDisassembler_Fail;

			MCOperand_CreateImm0(Inst, fieldFromInstruction_4(Insn, 0, 4));
			return S;
		}

		return DecodeRFEInstruction(Inst, Insn, Address, Decoder);
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail; // Tied
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeRegListOperand(Inst, reglist, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}